

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

int __thiscall
anon_unknown.dwarf_375::NinjaMain::ToolRecompact
          (NinjaMain *this,Options *options,int argc,char **argv)

{
  bool bVar1;
  char **argv_local;
  int argc_local;
  Options *options_local;
  NinjaMain *this_local;
  
  bVar1 = EnsureBuildDirExists(this);
  if (((bVar1) && (bVar1 = OpenBuildLog(this,true), bVar1)) &&
     (bVar1 = OpenDepsLog(this,true), bVar1)) {
    return 0;
  }
  return 1;
}

Assistant:

int NinjaMain::ToolRecompact(const Options* options, int argc, char* argv[]) {
  if (!EnsureBuildDirExists())
    return 1;

  if (OpenBuildLog(/*recompact_only=*/true) == LOAD_ERROR ||
      OpenDepsLog(/*recompact_only=*/true) == LOAD_ERROR)
    return 1;

  return 0;
}